

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void onquest(void)

{
  boolean bVar1;
  s_level *psVar2;
  
  if (((((ushort)u.uevent._0_2_ >> 5 & 1) == 0) && (bVar1 = on_level(&u.uz0,&u.uz), bVar1 == '\0'))
     && (psVar2 = Is_special(&u.uz), psVar2 != (s_level *)0x0)) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
    if (bVar1 == '\0') {
      bVar1 = on_level(&u.uz,&dungeon_topology.d_qlocate_level);
      if ((bVar1 == '\0') || (u.uz.dlevel <= u.uz0.dlevel)) {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_nemesis_level);
        if (bVar1 != '\0') {
          on_goal();
        }
      }
      else {
        on_locate();
      }
    }
    else {
      on_start();
    }
  }
  return;
}

Assistant:

void onquest(void)
{
	if (u.uevent.qcompleted || Not_firsttime) return;
	if (!Is_special(&u.uz)) return;

	if (Is_qstart(&u.uz)) on_start();
	else if (Is_qlocate(&u.uz) && u.uz.dlevel > u.uz0.dlevel) on_locate();
	else if (Is_nemesis(&u.uz)) on_goal();
	return;
}